

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O0

void testExpression(string *expr,double value)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  pointer pEVar3;
  unique_ptr<Value,_std::default_delete<Value>_> *this;
  pointer pVVar4;
  TypeName *pTVar5;
  char *pcVar6;
  optional<double> *message;
  double *pdVar7;
  string *in_RDI;
  AssertionResult gtest_ar_1;
  double res;
  NumberValueAnalyser analyser;
  AssertionResult gtest_ar;
  unique_ptr<Value,_std::default_delete<Value>_> *val;
  Executor executor;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> node;
  Parser parser;
  stringstream stream;
  istream *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  TypeName *in_stack_fffffffffffffb18;
  char *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  int line;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  undefined1 uVar8;
  Type type;
  AssertionResult local_498;
  double local_488;
  undefined1 local_480 [8];
  Message *in_stack_fffffffffffffb88;
  _Storage<double,_true> in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  AssertionResult local_440;
  unique_ptr<Value,_std::default_delete<Value>_> *local_430;
  Executor local_428;
  stringstream local_198 [40];
  double in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RDI,_Var2);
  Parser::Parser((Parser *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                 in_stack_fffffffffffffb08);
  Parser::parseLogicalExpression
            ((Parser *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  Executor::Executor((Executor *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
  pEVar3 = std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::operator->
                     ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)0x1eb94c);
  (*(pEVar3->super_Node)._vptr_Node[2])(pEVar3,&local_428);
  this = Executor::getValue(&local_428);
  local_430 = this;
  pVVar4 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x1eb990);
  pTVar5 = Value::getType(pVVar4);
  type = (Type)((ulong)pTVar5 >> 0x20);
  testing::internal::EqHelper::Compare<TypeName,_TypeName,_nullptr>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (TypeName *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
  line = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
  uVar8 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)this);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x1eba92);
    line = (int)((ulong)pcVar6 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this,type,(char *)CONCAT17(uVar8,in_stack_fffffffffffffb30),line,
               in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
    testing::Message::~Message((Message *)0x1ebaef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ebb5d);
  if (bVar1) {
    NumberValueAnalyser::NumberValueAnalyser
              ((NumberValueAnalyser *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10))
    ;
    pVVar4 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x1ebb87);
    (*pVVar4->_vptr_Value[3])(pVVar4,local_480);
    message = NumberValueAnalyser::getValue((NumberValueAnalyser *)local_480);
    pdVar7 = std::optional<double>::value
                       ((optional<double> *)
                        CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
    local_488 = *pdVar7;
    testing::internal::CmpHelperFloatingPointEQ<double>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    in_stack_fffffffffffffb17 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    if (!(bool)in_stack_fffffffffffffb17) {
      testing::Message::Message((Message *)this);
      testing::AssertionResult::failure_message((AssertionResult *)0x1ebc6d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this,type,(char *)CONCAT17(uVar8,in_stack_fffffffffffffb30),line,
                 (char *)message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
      testing::Message::~Message((Message *)0x1ebcb9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ebd05);
    NumberValueAnalyser::~NumberValueAnalyser((NumberValueAnalyser *)0x1ebd0f);
  }
  Executor::~Executor((Executor *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
  Parser::~Parser((Parser *)0x1ebd41);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void testExpression(const std::string expr, double value)
{
  std::stringstream stream{expr};
  Parser parser{stream};
  auto node = parser.parseLogicalExpression();

  Executor executor{};
  node->accept(executor);
  const auto& val = executor.getValue();
  ASSERT_EQ(val->getType(), TypeName::F32);

  NumberValueAnalyser analyser{};
  val->accept(analyser);
  const auto res = analyser.getValue().value();
  EXPECT_DOUBLE_EQ(res, value);
}